

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::restoredashinput(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  Cell *pCVar2;
  structSavedInput *save;
  
  requireDStackDepth(this,1,"RESTORE-INPUT");
  this_00 = &this->dStack;
  ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  requireDStackDepth(this,1,"RESTORE-INPUT");
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  save = (this->savedInputVector).
         super__Vector_base<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
         ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (save == (this->savedInputVector).
                super__Vector_base<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
      pCVar2 = &this->True;
LAB_00113f9f:
      ForthStack<unsigned_int>::setTop(this_00,*pCVar2);
      return;
    }
    if (save->saveId == uVar1) {
      restoreInput(this,save,false,false);
      pCVar2 = &this->False;
      goto LAB_00113f9f;
    }
    save = save + 1;
  } while( true );
}

Assistant:

void restoredashinput() {
#ifdef _DEBUG
			auto depth = dStack.stackDepth();
#endif
			REQUIRE_DSTACK_DEPTH(1, "RESTORE-INPUT");
			Cell n = dStack.getTop(); dStack.pop();
			REQUIRE_DSTACK_DEPTH(1, "RESTORE-INPUT");
			Cell saveId= dStack.getTop(); ;
			for (auto& save : savedInputVector) {
				if (save.saveId == saveId) {
					restoreInput(save, false,false);
					dStack.setTop(False); // can be restored
					// @bug delete this save from vector
					return;
				}
			}
			dStack.setTop(True); // cannot be restored
		}